

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::BinaryQuadraticModel
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,
          Linear<unsigned_int,_double> *linear,Quadratic<unsigned_int,_double> *quadratic,
          double *offset,Vartype vartype)

{
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&this->_quadmat);
  (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_label_to_idx)._M_h._M_buckets = &(this->_label_to_idx)._M_h._M_single_bucket;
  (this->_label_to_idx)._M_h._M_bucket_count = 1;
  (this->_label_to_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_label_to_idx)._M_h._M_element_count = 0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_label_to_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_offset = *offset;
  this->m_vartype = vartype;
  _initialize_quadmat<cimod::Sparse>(this,linear,quadratic,(dispatch_t<cimod::Sparse,_Sparse>)0x0);
  return;
}

Assistant:

BinaryQuadraticModel(
        const Linear<IndexType, FloatType> &linear,
        const Quadratic<IndexType, FloatType> &quadratic,
        const FloatType &offset,
        const Vartype vartype ) :
        m_offset( offset ),
        m_vartype( vartype ) {
      _initialize_quadmat( linear, quadratic );
    }